

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::cancelUntil(Solver *this,int level)

{
  int *piVar1;
  int iVar2;
  char *__function;
  int iVar3;
  long lVar4;
  
  if ((this->trail_lim).sz <= level) {
    return;
  }
  iVar3 = (this->trail).sz;
  lVar4 = (long)iVar3;
  piVar1 = (this->trail_lim).data;
  iVar2 = piVar1[level];
  if (iVar2 < iVar3) {
    do {
      lVar4 = lVar4 + -1;
      iVar3 = (this->trail).data[lVar4].x >> 1;
      if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
          iVar3) {
        __function = 
        "V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
        goto LAB_0010ac4c;
      }
      (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
      [iVar3].value = l_Undef;
      if ((1 < this->phase_saving) ||
         ((this->phase_saving == 1 &&
          ((this->trail_lim).data[(long)(this->trail_lim).sz + -1] < lVar4)))) {
        if (iVar3 < (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz)
        {
          (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar3] =
               (byte)(this->trail).data[lVar4].x & 1;
          goto LAB_0010ab97;
        }
LAB_0010ac20:
        __function = 
        "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
LAB_0010ac4c:
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                      ,0x28,__function);
      }
LAB_0010ab97:
      if (((this->order_heap).indices.map.sz <= iVar3) ||
         ((this->order_heap).indices.map.data[iVar3] < 0)) {
        if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar3)
        goto LAB_0010ac20;
        if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar3]
            != '\0') {
          Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::insert
                    (&this->order_heap,iVar3);
        }
      }
      piVar1 = (this->trail_lim).data;
      iVar2 = piVar1[level];
    } while (iVar2 < lVar4);
  }
  this->qhead = iVar2;
  vec<Minisat::Lit,_int>::shrink(&this->trail,(this->trail).sz - piVar1[level]);
  vec<int,_int>::shrink(&this->trail_lim,(this->trail_lim).sz - level);
  return;
}

Assistant:

void Solver::cancelUntil(int level) {
    if (decisionLevel() > level){
        for (int c = trail.size()-1; c >= trail_lim[level]; c--){
            Var      x  = var(trail[c]);
            assigns [x] = l_Undef;
            if (phase_saving > 1 || (phase_saving == 1 && c > trail_lim.last()))
                polarity[x] = sign(trail[c]);
            insertVarOrder(x); }
        qhead = trail_lim[level];
        trail.shrink(trail.size() - trail_lim[level]);
        trail_lim.shrink(trail_lim.size() - level);
    } }